

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O2

void __thiscall audiofft::OouraFFT::ifft(OouraFFT *this,float *data,float *re,float *im)

{
  ulong uVar1;
  double *a;
  size_t len;
  long lVar2;
  long lVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  
  uVar1 = this->_size;
  a = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start;
  lVar3 = 0;
  pdVar4 = a;
  for (lVar2 = uVar1 * 8; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    *pdVar4 = (double)*(float *)((long)re + lVar3);
    pdVar4[1] = -(double)*(float *)((long)im + lVar3);
    pdVar4 = pdVar4 + 2;
    lVar3 = lVar3 + 4;
  }
  a[1] = (double)*(float *)((long)re + (uVar1 & 0xfffffffffffffffe) * 2);
  rdft(this,(int)uVar1,-1,a,
       (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
  len = this->_size;
  auVar5._8_4_ = (int)(len >> 0x20);
  auVar5._0_8_ = len;
  auVar5._12_4_ = 0x45300000;
  detail::ScaleBuffer<float,double,double>
            (data,(this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
             2.0 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)),len);
  return;
}

Assistant:

virtual void ifft(float* data, const float* re, const float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            const float *r = re;
            const float *i = im;
            while (b != bEnd)
            {
              *(b++) = static_cast<double>(*(r++));
              *(b++) = -static_cast<double>(*(i++));
            }
            _buffer[1] = re[_size / 2];
          }

          rdft(static_cast<int>(_size), -1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          detail::ScaleBuffer(data, _buffer.data(), 2.0 / static_cast<double>(_size), _size);
        }